

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression_rec
          (xpath_parser *this,xpath_ast_node *lhs,int limit)

{
  xpath_lexer *lexer;
  xpath_parse_result *pxVar1;
  xpath_ast_node *right;
  ast_type_t type;
  binary_op_t bVar2;
  binary_op_t bVar3;
  
  lexer = &this->_lexer;
  while( true ) {
    bVar2 = binary_op_t::parse(lexer);
    type = bVar2.asttype;
    if (type == ast_unknown) {
      return lhs;
    }
    if (bVar2.precedence < limit) {
      return lhs;
    }
    xpath_lexer::next(lexer);
    right = parse_path_or_unary_expression(this);
    while( true ) {
      if (right == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      bVar3 = binary_op_t::parse(lexer);
      if ((bVar3.asttype == ast_unknown) || (bVar3.precedence <= bVar2.precedence)) break;
      right = parse_expression_rec(this,right,bVar3.precedence);
    }
    if ((type == ast_op_union) && ((lhs->_rettype != '\x01' || (right->_rettype != '\x01')))) break;
    lhs = alloc_node(this,type,bVar2.rettype,lhs,right);
    if (lhs == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
  }
  pxVar1 = this->_result;
  pxVar1->error = "Union operator has to be applied to node sets";
  pxVar1->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_expression_rec(xpath_ast_node* lhs, int limit)
		{
			binary_op_t op = binary_op_t::parse(_lexer);

			while (op.asttype != ast_unknown && op.precedence >= limit)
			{
				_lexer.next();

				xpath_ast_node* rhs = parse_path_or_unary_expression();
				if (!rhs) return 0;

				binary_op_t nextop = binary_op_t::parse(_lexer);

				while (nextop.asttype != ast_unknown && nextop.precedence > op.precedence)
				{
					rhs = parse_expression_rec(rhs, nextop.precedence);
					if (!rhs) return 0;

					nextop = binary_op_t::parse(_lexer);
				}

				if (op.asttype == ast_op_union && (lhs->rettype() != xpath_type_node_set || rhs->rettype() != xpath_type_node_set))
					return error("Union operator has to be applied to node sets");

				lhs = alloc_node(op.asttype, op.rettype, lhs, rhs);
				if (!lhs) return 0;

				op = binary_op_t::parse(_lexer);
			}

			return lhs;
		}